

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_movep(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg1;
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  TCGv_i32 ret;
  TCGv_i32 pTVar4;
  TCGv_i32 *ppTVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  uVar2 = insn & 7;
  if (((uint)s->writeback_mask >> uVar2 & 1) == 0) {
    ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar5 = s->writeback;
  }
  pTVar4 = ppTVar5[uVar2];
  arg1 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,pTVar4,(int)(short)uVar1);
  pTVar4 = tcg_temp_new_i32(tcg_ctx);
  iVar3 = ((insn & 0x40) >> 5) + 2;
  if ((char)insn < '\0') {
    iVar3 = iVar3 * 8;
    while (iVar3 = iVar3 + -8, iVar3 != -8) {
      tcg_gen_shri_i32_m68k(tcg_ctx,pTVar4,arg1,iVar3);
      tcg_gen_qemu_st8(tcg_ctx,pTVar4,ret,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      if (iVar3 != 0) {
        tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,2);
      }
    }
  }
  else {
    uVar2 = iVar3 * 8;
    while (uVar2 = uVar2 - 8, uVar2 != 0xfffffff8) {
      tcg_gen_qemu_ld8u(tcg_ctx,pTVar4,ret,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      tcg_gen_deposit_i32_m68k(tcg_ctx,arg1,arg1,pTVar4,uVar2,8);
      if (uVar2 != 0) {
        tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,2);
      }
    }
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(movep)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint8_t i;
    int16_t displ;
    TCGv reg;
    TCGv addr;
    TCGv abuf;
    TCGv dbuf;

    displ = read_im16(env, s);

    addr = AREG(insn, 0);
    reg = DREG(insn, 9);

    abuf = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, abuf, addr, displ);
    dbuf = tcg_temp_new(tcg_ctx);

    if (insn & 0x40) {
        i = 4;
    } else {
        i = 2;
    }

    if (insn & 0x80) {
        for ( ; i > 0 ; i--) {
            tcg_gen_shri_i32(tcg_ctx, dbuf, reg, (i - 1) * 8);
            tcg_gen_qemu_st8(tcg_ctx, dbuf, abuf, IS_USER(s));
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    } else {
        for ( ; i > 0 ; i--) {
            tcg_gen_qemu_ld8u(tcg_ctx, dbuf, abuf, IS_USER(s));
            tcg_gen_deposit_i32(tcg_ctx, reg, reg, dbuf, (i - 1) * 8, 8);
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    }
    tcg_temp_free(tcg_ctx, abuf);
    tcg_temp_free(tcg_ctx, dbuf);
}